

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O2

void __thiscall
optimization::global_expr_move::Global_Expr_Mov::optimize_func
          (Global_Expr_Mov *this,MirFunction *func)

{
  char cVar1;
  Op op_00;
  key_type labelId;
  undefined8 uVar2;
  _func_int **pp_Var3;
  int iVar4;
  mapped_type *pmVar5;
  iterator __position;
  _Base_ptr p_Var6;
  long lVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __position_00;
  _Rb_tree_node_base *p_Var16;
  ostream *poVar17;
  _Base_ptr p_Var18;
  pointer __args;
  Tag *tag;
  Function *function;
  Inst *pIVar19;
  int id_1;
  value_type start;
  mapped_type var_1;
  _Self __tmp;
  LoadOp op;
  LabelId id;
  list<int,_std::allocator<int>_> queue;
  VarId rhs;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  mapped_type var;
  Var_Replace vp;
  Livevar_Analyse lva;
  key_type local_4b4;
  int local_4b0;
  ostream local_4a9;
  uint local_4a8;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_4a0;
  Global_Expr_Mov *local_498;
  mapped_type *local_490;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_488;
  undefined **local_480;
  undefined1 local_478 [32];
  undefined1 local_458 [88];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined **local_3c0;
  string local_3b8;
  Tag local_398;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_368;
  VarId local_338;
  VarId local_328;
  VarId local_318;
  VarId local_308;
  VarId local_2f8;
  undefined **local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8;
  Op local_2d0;
  Var_Replace local_288;
  Value local_220;
  Value local_200;
  Livevar_Analyse local_1e0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_170;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_120;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_d0;
  _Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
  local_80 [80];
  
  if (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false) {
    p_Var18 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_478._16_8_ = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
    local_4a0 = &func->variables;
    local_498 = this;
    local_478._8_8_ = func;
    for (p_Var6 = p_Var18; p_Var6 != (_Base_ptr)local_478._16_8_;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      __position._M_current =
           (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)p_Var6[3]._M_parent
      ;
      while ((_Base_ptr)__position._M_current != p_Var6[3]._M_left) {
        iVar4 = (*((((__position._M_current)->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if (iVar4 == 2) {
          if (*(int *)&p_Var6[1]._M_left == *(int *)&p_Var18[1]._M_left) break;
          pmVar5 = std::
                   map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::at(local_4a0,
                        &((((__position._M_current)->_M_t).
                           super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id)
          ;
          pmVar5->is_temp_var = false;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                      *)&p_Var18[3]._M_parent,__position._M_current);
          __position = std::
                       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       ::erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)&p_Var6[3]._M_parent,(const_iterator)__position._M_current);
        }
        else {
          __position._M_current = __position._M_current + 1;
        }
      }
    }
    local_488 = &func->basic_blks;
    local_478._24_8_ = &local_498->offset;
    local_3c0 = &PTR_display_001db058;
    local_3e0._24_8_ = &PTR_display_001db238;
    do {
      uVar2 = local_478._8_8_;
      livevar_analyse::Livevar_Analyse::Livevar_Analyse
                (&local_1e0,(MirFunction *)local_478._8_8_,false);
      livevar_analyse::Livevar_Analyse::build(&local_1e0);
      var_replace::Var_Replace::Var_Replace(&local_288,(MirFunction *)uVar2);
      std::
      make_shared<optimization::global_expr_move::Env,mir::inst::MirFunction&,optimization::livevar_analyse::Livevar_Analyse&,optimization::var_replace::Var_Replace&,bool&>
                ((MirFunction *)local_458,(Livevar_Analyse *)uVar2,(Var_Replace *)&local_1e0,
                 (bool *)&local_288);
      std::__shared_ptr<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2> *)
                 &env,(__shared_ptr<optimization::global_expr_move::Env,_(__gnu_cxx::_Lock_policy)2>
                       *)local_458);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 8));
      local_3e0._16_8_ = (_Base_ptr)0x0;
      local_368._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_368._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_368._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_368._M_impl.super__Rb_tree_header._M_header;
      local_368._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_3e0._0_8_ = (_Base_ptr)local_3e0;
      local_3e0._8_8_ = (_Base_ptr)local_3e0;
      local_368._M_impl.super__Rb_tree_header._M_header._M_right =
           local_368._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar7 = std::_Rb_tree_decrement((_Rb_tree_node_base *)local_478._16_8_);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                ((list<int,_std::allocator<int>_> *)local_3e0,(value_type_conflict3 *)(lVar7 + 0x20)
                );
      local_4a8 = 0;
      while( true ) {
        if ((_Base_ptr)local_3e0._0_8_ == (_Base_ptr)local_3e0) break;
        local_4b0 = *(int *)(local_3e0._0_8_ + 0x10);
        std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                  ((list<int,_std::allocator<int>_> *)local_3e0);
        sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&local_368,&local_4b0);
        if (sVar8 == 0) {
          pmVar9 = std::
                   map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   ::at(local_488,&local_4b0);
          local_490 = std::
                      map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                      ::operator[](&local_1e0.livevars,&local_4b0);
          __args = (pmVar9->inst).
                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          while (__args != (pmVar9->inst).
                           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
            pmVar5 = std::
                     map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                     ::at(local_4a0,
                          &(((__args->_M_t).
                             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).
                           id);
            if (pmVar5->is_phi_var == true) {
LAB_0012acbc:
              __args = __args + 1;
            }
            else {
              iVar4 = (*(((__args->_M_t).
                          super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                        super_Displayable)._vptr_Displayable[1])();
              pIVar19 = (__args->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
              if (iVar4 == 1) {
                if ((pIVar19->super_Displayable)._vptr_Displayable != (_func_int **)local_3c0) {
                  pIVar19 = (Inst *)0x0;
                }
                if ((*(char *)&pIVar19[2].super_Displayable._vptr_Displayable != '\0') ||
                   (*(char *)&pIVar19[3].dest.super_Displayable._vptr_Displayable != '\0')) {
                  local_4b4 = -1;
                  op_00 = pIVar19[3].dest.id;
                  mir::inst::Value::Value(&local_200,(Value *)(pIVar19 + 1));
                  mir::inst::Value::Value(&local_220,(Value *)&pIVar19[2].dest);
                  Op::Op(&local_2d0,op_00,&local_200,&local_220);
                  cVar1 = *(char *)&pIVar19[3].dest.super_Displayable._vptr_Displayable;
                  if (*(char *)&pIVar19[2].super_Displayable._vptr_Displayable == '\0') {
                    if (cVar1 != '\0') {
                      pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)&pIVar19[2].dest.id);
                      local_458._0_8_ = &PTR_display_001d90d0;
                      local_458._8_4_ = pvVar10->id;
                      sVar13 = std::
                               set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                               ::count((((local_490->
                                         super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->live_vars_in).
                                       super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr,(key_type *)local_458);
                      iVar4 = local_4b0;
                      if (sVar13 == 0) goto LAB_0012acbc;
                      std::__detail::__variant::
                      _Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      ::_Variant_storage<0ul,optimization::global_expr_move::Op&>
                                ((_Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                                  *)&local_170,&local_2d0);
                      local_4b4 = bfs(local_498,iVar4,&local_170);
                    }
LAB_0012a8fa:
                    if (local_4b4 != local_4b0) {
                      pmVar11 = std::
                                map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                      *)(env + 0x10),&local_4b4);
                      pmVar14 = std::__detail::
                                _Map_base<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                ::at((_Map_base<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)pmVar11,&local_2d0);
                      local_480 = &PTR_display_001d90d0;
                      local_478._0_4_ = pmVar14->id;
                      tag = (Tag *)local_478;
                      pmVar5 = std::
                               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                               ::at(local_4a0,(key_type_conflict *)tag);
                      labelId = local_4b4;
                      if (pmVar5->is_phi_var == true) {
                        local_2f8.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_2f8.id = (((__args->_M_t).
                                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl)->dest).id;
                        pmVar15 = std::
                                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                  ::at(local_488,&local_4b4);
                        var_replace::Var_Replace::setdefpoint
                                  (&local_288,&local_2f8,labelId,
                                   (int)((ulong)((long)(pmVar15->inst).
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(pmVar15->inst).
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
                        (*(((__args->_M_t).
                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                          super_Displayable)._vptr_Displayable[2])(local_458);
                        for (p_Var16 = (_Rb_tree_node_base *)local_458._24_8_;
                            p_Var16 != (_Rb_tree_node_base *)(local_458 + 8);
                            p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
                          local_398._vptr_Tag = (_func_int **)&PTR_display_001d90d0;
                          local_398.text._M_dataplus._M_p._0_4_ = *(uint32_t *)&p_Var16[1]._M_parent
                          ;
                          this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *
                                    )std::
                                     map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                     ::at(&local_288.usepoints,(key_type *)&local_398);
                          local_400._0_4_ = pmVar9->id;
                          local_400._4_4_ =
                               (undefined4)
                               ((ulong)((long)__args -
                                       (long)(pmVar9->inst).
                                             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
                          __position_00 =
                               std::
                               __find_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<int,int>const>>
                                         (*(undefined8 *)this_00,*(undefined8 *)(this_00 + 8),
                                          local_400);
                          if (__position_00._M_current != *(pair<int,_int> **)(this_00 + 8)) {
                            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ::erase((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                     *)this_00,(const_iterator)__position_00._M_current);
                            pmVar15 = std::
                                      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                      ::at(local_488,&local_4b4);
                            local_3b8._M_dataplus._M_p._0_4_ = local_4b4;
                            local_3b8._M_dataplus._M_p._4_4_ =
                                 (undefined4)
                                 ((ulong)((long)(pmVar15->inst).
                                                super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pmVar15->inst).
                                               super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
                            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                            emplace_back<std::pair<int,int>>(this_00,(pair<int,_int> *)&local_3b8);
                          }
                        }
                        std::
                        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                     *)local_458);
                        pmVar15 = std::
                                  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                  ::at(local_488,&local_4b4);
                        std::
                        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                        ::
                        emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                  ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                    *)&pmVar15->inst,__args);
                        local_458._0_8_ = &PTR_display_001d90d0;
                        local_458._8_4_ = ~_S_red;
                        local_400._0_4_ = -1;
                        std::make_unique<mir::inst::AssignInst,mir::inst::VarId,int>
                                  ((VarId *)&local_398,(int *)local_458);
                        pp_Var3 = local_398._vptr_Tag;
                        local_398._vptr_Tag = (_func_int **)0x0;
                        pIVar19 = (__args->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (__args->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                             (Inst *)pp_Var3;
                        if (pIVar19 != (Inst *)0x0) {
                          (*(pIVar19->super_Displayable)._vptr_Displayable[5])();
                        }
                        std::
                        unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                       *)&local_398);
                      }
                      else {
                        local_4a9 = (ostream)0x0;
                        AixLog::operator<<(&local_4a9,(Severity *)tag);
                        AixLog::Tag::Tag(&local_398);
                        AixLog::operator<<((ostream *)&local_398,tag);
                        local_2e0 = std::chrono::_V2::system_clock::now();
                        local_2e8 = &PTR__Timestamp_001d8f28;
                        local_2d8 = 0;
                        AixLog::operator<<((ostream *)&local_2e8,(Timestamp *)tag);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_400,"optimize_func",&local_4a1);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_3b8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_expression_move.hpp"
                                   ,&local_4a2);
                        function = (Function *)local_400;
                        AixLog::Function::Function
                                  ((Function *)local_458,(string *)function,&local_3b8,0x161);
                        AixLog::operator<<((ostream *)local_458,function);
                        pIVar19 = (__args->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (**(pIVar19->dest).super_Displayable._vptr_Displayable)
                                  (&pIVar19->dest,&std::clog);
                        poVar17 = std::operator<<((ostream *)&std::clog," is replaced to ");
                        (*(code *)*local_480)(&local_480,poVar17);
                        std::endl<char,std::char_traits<char>>(poVar17);
                        AixLog::Function::~Function((Function *)local_458);
                        std::__cxx11::string::~string((string *)&local_3b8);
                        std::__cxx11::string::~string((string *)local_400);
                        AixLog::Tag::~Tag(&local_398);
                        local_308.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_308.id = (((__args->_M_t).
                                         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl)->dest).id;
                        local_318.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001d90d0;
                        local_318.id = local_478._0_4_;
                        var_replace::Var_Replace::replace(&local_288,&local_308,&local_318);
                        local_398._vptr_Tag =
                             (_func_int **)CONCAT44(local_398._vptr_Tag._4_4_,0xfffffc19);
                        std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int>
                                  ((VarId *)local_458,
                                   (int *)&((__args->_M_t).
                                            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                            .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                           _M_head_impl)->dest);
                        uVar2 = local_458._0_8_;
                        local_458._0_8_ = (_func_int **)0x0;
                        pIVar19 = (__args->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        (__args->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                             (Inst *)uVar2;
                        if (pIVar19 != (Inst *)0x0) {
                          (*(pIVar19->super_Displayable)._vptr_Displayable[5])();
                        }
                        std::
                        unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                        ::~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                                       *)local_458);
                      }
                      local_458._0_4_ = local_478._0_4_;
                      pmVar5 = std::
                               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                               ::at(local_4a0,(key_type_conflict *)local_458);
                      goto LAB_0012acad;
                    }
                  }
                  else if (cVar1 == '\0') {
                    pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)&pIVar19[1].dest);
                    local_458._0_8_ = &PTR_display_001d90d0;
                    local_458._8_4_ = pvVar10->id;
                    sVar13 = std::
                             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             ::count((((local_490->
                                       super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->live_vars_in).
                                     super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(key_type *)local_458);
                    iVar4 = local_4b0;
                    if (sVar13 != 0) {
                      std::__detail::__variant::
                      _Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      ::_Variant_storage<0ul,optimization::global_expr_move::Op&>
                                ((_Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                                  *)&local_120,&local_2d0);
                      local_4b4 = bfs(local_498,iVar4,&local_120);
                      goto LAB_0012a8fa;
                    }
                  }
                  else {
                    pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)&pIVar19[1].dest);
                    local_458._0_8_ = &PTR_display_001d90d0;
                    local_458._8_4_ = pvVar10->id;
                    pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)&pIVar19[2].dest.id);
                    local_398._vptr_Tag = (_func_int **)&PTR_display_001d90d0;
                    local_398.text._M_dataplus._M_p._0_4_ = pvVar10->id;
                    sVar13 = std::
                             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                             ::count((((local_490->
                                       super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr)->live_vars_in).
                                     super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(key_type *)local_458);
                    if ((sVar13 != 0) &&
                       (sVar13 = std::
                                 set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                 ::count((((local_490->
                                           super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->live_vars_in).
                                         super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,(key_type *)&local_398), iVar4 = local_4b0,
                       sVar13 != 0)) {
                      std::__detail::__variant::
                      _Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      ::_Variant_storage<0ul,optimization::global_expr_move::Op&>
                                ((_Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                                  *)&local_d0,&local_2d0);
                      local_4b4 = bfs(local_498,iVar4,&local_d0);
                      goto LAB_0012a8fa;
                    }
                  }
                }
                goto LAB_0012acbc;
              }
              if ((iVar4 != 3) || (*(bool *)local_478._24_8_ != true)) goto LAB_0012acbc;
              if ((pIVar19->super_Displayable)._vptr_Displayable != (_func_int **)local_3e0._24_8_)
              {
                pIVar19 = (Inst *)0x0;
              }
              pvVar10 = std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)&pIVar19[1].dest);
              std::pair<mir::inst::VarId,_mir::inst::Value>::
              pair<mir::inst::VarId_&,_mir::inst::Value_&,_true>
                        ((pair<mir::inst::VarId,_mir::inst::Value> *)&local_2d0,pvVar10,
                         (Value *)&pIVar19[2].dest);
              std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>::
              pair<mir::inst::VarId_&,_true>
                        ((pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> *)
                         local_458,(pair<mir::inst::VarId,_mir::inst::Value> *)&local_2d0,
                         &pIVar19->dest);
              iVar4 = local_4b0;
              std::__detail::__variant::
              _Variant_storage<true,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
              ::
              _Variant_storage<1ul,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>&>
                        (local_80,local_458);
              local_400._0_4_ =
                   bfs(local_498,iVar4,
                       (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        *)local_80);
              if (local_400._0_4_ == local_4b0) goto LAB_0012acbc;
              pmVar11 = std::
                        map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                        ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                              *)(env + 0x10),(key_type *)local_400);
              pmVar12 = std::
                        map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                        ::at(&pmVar11->loads,(key_type *)local_458);
              local_2d0._0_8_ = &PTR_display_001d90d0;
              local_2d0.lhs.super_Displayable._vptr_Displayable._0_4_ = pmVar12->id;
              pmVar5 = std::
                       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       ::at(local_4a0,(key_type_conflict *)&local_2d0.lhs);
              if (pmVar5->is_phi_var == true) goto LAB_0012acbc;
              local_328.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              local_328.id = (((__args->_M_t).
                               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                               .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest)
                             .id;
              local_338.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
              local_338.id = (uint32_t)local_2d0.lhs.super_Displayable._vptr_Displayable;
              var_replace::Var_Replace::replace(&local_288,&local_328,&local_338);
              local_3b8._M_dataplus._M_p._0_4_ = -999;
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,int>
                        ((VarId *)&local_398,
                         (int *)&((__args->_M_t).
                                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                                 dest);
              pp_Var3 = local_398._vptr_Tag;
              local_398._vptr_Tag = (_func_int **)0x0;
              pIVar19 = (__args->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
              (__args->_M_t).
              super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
              super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)pp_Var3;
              if (pIVar19 != (Inst *)0x0) {
                (*(pIVar19->super_Displayable)._vptr_Displayable[5])();
              }
              std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
              ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                           *)&local_398);
              local_398._vptr_Tag =
                   (_func_int **)
                   CONCAT44(local_398._vptr_Tag._4_4_,
                            (uint32_t)local_2d0.lhs.super_Displayable._vptr_Displayable);
              pmVar5 = std::
                       map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       ::at(local_4a0,(key_type_conflict *)&local_398);
LAB_0012acad:
              pmVar5->is_temp_var = false;
              local_4a8 = (uint)CONCAT71((int7)((ulong)pmVar5 >> 8),1);
            }
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_368,&local_4b0);
          for (p_Var18 = (pmVar9->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var18 != &(pmVar9->preceding)._M_t._M_impl.super__Rb_tree_header;
              p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
            local_458._0_4_ = p_Var18[1]._M_color;
            std::__cxx11::list<int,_std::allocator<int>_>::push_back
                      ((list<int,_std::allocator<int>_> *)local_3e0,
                       (value_type_conflict3 *)local_458);
          }
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_368);
      std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                ((_List_base<int,_std::allocator<int>_> *)local_3e0);
      var_replace::Var_Replace::~Var_Replace(&local_288);
      livevar_analyse::Livevar_Analyse::~Livevar_Analyse(&local_1e0);
    } while ((local_4a8 & 1) != 0);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }

    auto& startblk = func.basic_blks.begin()->second;
    for (auto& blkpair : func.basic_blks) {
      auto& blk = blkpair.second;
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        auto& inst = *iter;
        if (inst->inst_kind() == mir::inst::InstKind::Ref) {
          auto& i = *inst;
          auto refinst = dynamic_cast<mir::inst::RefInst*>(&i);
          if (blk.id == startblk.id) {
            break;
          }
          func.variables.at(inst->dest.id).is_temp_var = false;
          startblk.inst.push_back(std::move(inst));
          iter = blk.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
    int cnt = 0;
    while (true) {
      bool modify = false;
      livevar_analyse::Livevar_Analyse lva(func);
      lva.build();
      var_replace::Var_Replace vp(func);
      env = std::make_shared<Env>(func, lva, vp, offset);
      std::list<mir::types::LabelId> queue;
      std::set<mir::types::LabelId> visited;
      auto iter = func.basic_blks.end();
      iter--;
      queue.push_back(iter->first);
      while (!queue.empty()) {
        auto start = queue.front();
        queue.pop_front();
        if (visited.count(start)) {
          continue;
        }

        auto& blk = func.basic_blks.at(start);
        {  // visit logic
          auto& block = blk;
          auto& blv = lva.livevars[start];
          auto& variables = func.variables;
          for (auto iter = block.inst.begin(); iter != block.inst.end();) {
            auto& inst = *iter;
            if (func.variables.at(inst->dest.id).is_phi_var) {
              iter++;
              continue;
            }
            auto kind = inst->inst_kind();
            auto& i = *inst;
            switch (kind) {
              case mir::inst::InstKind::Op: {
                auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
                if (opInst->lhs.is_immediate() && opInst->rhs.is_immediate()) {
                  break;
                }
                int id = -1;
                Op op(opInst->op, opInst->lhs, opInst->rhs);
                if (!opInst->lhs.is_immediate() &&
                    !opInst->rhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(lhs) ||
                      !blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                } else if (!opInst->lhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  if (!blv->live_vars_in->count(lhs)) {
                    break;
                  }
                  id = bfs(start, op);

                } else if (!opInst->rhs.is_immediate()) {
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                }
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).ops.at(op);
                if (func.variables.at(var.id).is_phi_var) {
                  vp.setdefpoint(inst->dest, id,
                                 func.basic_blks.at(id).inst.size());
                  for (auto var : inst->useVars()) {
                    auto& usepoints = vp.usepoints.at(var);
                    std::pair<mir::types::LabelId, int> point = {
                        blk.id, iter - block.inst.begin()};
                    auto find_iter =
                        std::find(usepoints.begin(), usepoints.end(), point);
                    if (find_iter != usepoints.end()) {
                      usepoints.erase(find_iter);
                      usepoints.push_back(
                          {id, func.basic_blks.at(id).inst.size()});
                    }
                  }
                  func.basic_blks.at(id).inst.push_back(std::move(inst));
                  inst = std::make_unique<mir::inst::AssignInst>(
                      mir::inst::VarId(-1), -1);
                } else {
                  LOG(TRACE)
                      << inst->dest << " is replaced to " << var << std::endl;
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                }
                func.variables.at(var).is_temp_var = false;
                modify = true;
                continue;
              }
              case mir::inst::InstKind::Load: {
                if (!offset) {
                  break;
                }
                auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
                LoadOp op = {{std::get<mir::inst::VarId>(loadInst->src),
                              loadInst->offset},
                             loadInst->dest};
                auto id = bfs(start, op);
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).loads.at(op.first);
                if (!func.variables.at(var.id).is_phi_var) {
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                  func.variables.at(var).is_temp_var = false;
                  modify = true;
                  continue;
                } else {
                  break;
                }
              }
              // case mir::inst::InstKind::Store: {
              //   auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);

              //   break;
              // }
              default:;
            }
            iter++;
          }
        }
        visited.insert(start);
        for (auto pre : blk.preceding) {
          queue.push_back(pre);
        }
      }
      if (!modify) {
        break;
      }
    }
  }